

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test1::isMatrixUniformFunction(GPUShaderFP64Test1 *this,_uniform_function func)

{
  undefined1 local_15;
  _uniform_function func_local;
  GPUShaderFP64Test1 *this_local;
  
  local_15 = true;
  if (((((func != UNIFORM_FUNCTION_MATRIX2DV) &&
        (local_15 = true, func != UNIFORM_FUNCTION_MATRIX2X3DV)) &&
       (local_15 = true, func != UNIFORM_FUNCTION_MATRIX2X4DV)) &&
      ((local_15 = true, func != UNIFORM_FUNCTION_MATRIX3DV &&
       (local_15 = true, func != UNIFORM_FUNCTION_MATRIX3X2DV)))) &&
     ((local_15 = true, func != UNIFORM_FUNCTION_MATRIX3X4DV &&
      ((local_15 = true, func != UNIFORM_FUNCTION_MATRIX4DV &&
       (local_15 = true, func != UNIFORM_FUNCTION_MATRIX4X2DV)))))) {
    local_15 = func == UNIFORM_FUNCTION_MATRIX4X3DV;
  }
  return local_15;
}

Assistant:

bool GPUShaderFP64Test1::isMatrixUniformFunction(_uniform_function func)
{
	return (func == UNIFORM_FUNCTION_MATRIX2DV || func == UNIFORM_FUNCTION_MATRIX2X3DV ||
			func == UNIFORM_FUNCTION_MATRIX2X4DV || func == UNIFORM_FUNCTION_MATRIX3DV ||
			func == UNIFORM_FUNCTION_MATRIX3X2DV || func == UNIFORM_FUNCTION_MATRIX3X4DV ||
			func == UNIFORM_FUNCTION_MATRIX4DV || func == UNIFORM_FUNCTION_MATRIX4X2DV ||
			func == UNIFORM_FUNCTION_MATRIX4X3DV);
}